

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitGetObjectProperty
               (RegSlot resultReg,RegSlot objectReg,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  uint cacheId;
  
  cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,objectReg,propertyId,false,false);
  Js::ByteCodeWriter::PatchableProperty
            (&byteCodeGenerator->m_writer,LdFld,resultReg,objectReg,cacheId,false,false);
  return;
}

Assistant:

void EmitGetObjectProperty(
    Js::RegSlot resultReg,
    Js::RegSlot objectReg,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    uint cacheId = funcInfo->FindOrAddInlineCacheId(
        objectReg,
        propertyId,
        /* isLoadMethod */ false,
        /* isStore */ false);

    byteCodeGenerator->Writer()->PatchableProperty(
        Js::OpCode::LdFld,
        resultReg,
        objectReg,
        cacheId,
        /* isCtor */ false,
        /* registerCacheIdForCall */ false);
}